

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

uint32_t __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::FindIndex
          (NodeSet *this,int32_t v)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  
  uVar5 = (this->table_).size_ - 1;
  uVar4 = v * 5;
  uVar6 = v * 0x29 & uVar5;
  uVar7 = 0;
  bVar3 = false;
  do {
    iVar1 = (this->table_).ptr_[uVar6];
    if (iVar1 == v) {
      bVar2 = false;
      uVar4 = uVar6;
    }
    else {
      if (iVar1 == -2) {
        if (!bVar3) {
          bVar3 = true;
          uVar7 = uVar6;
        }
      }
      else if (iVar1 == -1) {
        uVar4 = uVar6;
        if (bVar3) {
          uVar4 = uVar7;
        }
        bVar2 = false;
        goto LAB_0035bc19;
      }
      uVar6 = uVar6 + 1 & uVar5;
      bVar2 = true;
    }
LAB_0035bc19:
    if (!bVar2) {
      return uVar4;
    }
  } while( true );
}

Assistant:

uint32_t size() const { return size_; }